

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampTest::TextureBorderClampTest
          (TextureBorderClampTest *this,Context *context,char *name,char *description,
          deUint32 texFormat,DepthStencilMode mode,StateType stateType,int texWidth,int texHeight,
          SamplingFunction samplingFunction,deUint32 flags)

{
  TextureChannelClass TVar1;
  TestContext *this_00;
  TestLog *log;
  allocator<char> local_61;
  string local_60;
  DepthStencilMode local_30;
  deUint32 local_2c;
  DepthStencilMode mode_local;
  deUint32 texFormat_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  TextureBorderClampTest *this_local;
  
  local_30 = mode;
  local_2c = texFormat;
  _mode_local = description;
  description_local = name;
  name_local = (char *)context;
  context_local = (Context *)this;
  gles31::TestCase::TestCase(&this->super_TestCase,context,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureBorderClampTest_032b6870;
  this->m_texFormat = local_2c;
  this->m_sampleMode = local_30;
  TVar1 = getFormatChannelClass(local_2c,local_30);
  this->m_channelClass = TVar1;
  this->m_stateType = stateType;
  this->m_texHeight = texHeight;
  this->m_texWidth = texWidth;
  this->m_samplingFunction = samplingFunction;
  this->m_useShadowSampler = (bool)((byte)flags & 1);
  de::details::MovePtr<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>::MovePtr
            (&this->m_texture);
  de::details::
  MovePtr<deqp::gls::TextureTestUtil::TextureRenderer,_de::DefaultDeleter<deqp::gls::TextureTestUtil::TextureRenderer>_>
  ::MovePtr(&this->m_renderer);
  de::details::MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::MovePtr
            (&this->m_gatherProgram);
  this->m_iterationNdx = 0;
  this_00 = gles31::Context::getTestContext((Context *)name_local);
  log = tcu::TestContext::getLog(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_61);
  tcu::ResultCollector::ResultCollector(&this->m_result,log,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  return;
}

Assistant:

TextureBorderClampTest::TextureBorderClampTest (Context&						context,
												const char*						name,
												const char*						description,
												deUint32						texFormat,
												tcu::Sampler::DepthStencilMode	mode,
												StateType						stateType,
												int								texWidth,
												int								texHeight,
												SamplingFunction				samplingFunction,
												deUint32						flags)
	: TestCase				(context, name, description)
	, m_texFormat			(texFormat)
	, m_sampleMode			(mode)
	, m_channelClass		(getFormatChannelClass(texFormat, mode))
	, m_stateType			(stateType)
	, m_texHeight			(texHeight)
	, m_texWidth			(texWidth)
	, m_samplingFunction	(samplingFunction)
	, m_useShadowSampler	((flags & FLAG_USE_SHADOW_SAMPLER) != 0)
	, m_iterationNdx		(0)
	, m_result				(context.getTestContext().getLog())
{
	DE_ASSERT(stateType < STATE_LAST);
	DE_ASSERT(samplingFunction < SAMPLE_LAST);
	// mode must be set for combined depth-stencil formats
	DE_ASSERT(m_channelClass != tcu::TEXTURECHANNELCLASS_LAST || mode != tcu::Sampler::MODE_LAST);
}